

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TType::isImage(TType *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->field_0x8 == '\x0e') {
    iVar1 = (*this->_vptr_TType[8])();
    if ((*(uint *)CONCAT44(extraout_var,iVar1) >> 0x13 & 1) != 0) {
      return ((*(uint *)CONCAT44(extraout_var,iVar1) & 0xff00) - 0x700 & 0xfffffe00) != 0;
    }
  }
  return false;
}

Assistant:

virtual bool isImage() const { return basicType == EbtSampler && getSampler().isImage(); }